

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool trans_BX(DisasContext_conflict1 *s,arg_BX *a)

{
  int reg;
  TCGContext_conflict1 *pTVar1;
  TCGTemp *pTVar2;
  uint uVar3;
  TCGv_i32 var;
  
  uVar3 = (uint)s->features;
  if ((uVar3 >> 0xe & 1) != 0) {
    reg = a->rm;
    pTVar1 = s->uc->tcg_ctx;
    pTVar2 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I32,false);
    var = (TCGv_i32)((long)pTVar2 - (long)pTVar1);
    load_reg_var(s,var,reg);
    pTVar1 = s->uc->tcg_ctx;
    (s->base).is_jmp = DISAS_TARGET_0;
    tcg_gen_andi_i32_aarch64(pTVar1,pTVar1->cpu_R[0xf],var,-2);
    tcg_gen_andi_i32_aarch64(pTVar1,var,var,1);
    tcg_gen_op3_aarch64(pTVar1,INDEX_op_st_i32,(TCGArg)(var + (long)pTVar1),
                        (TCGArg)(pTVar1->cpu_env + (long)pTVar1),0x220);
    tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(var + (long)pTVar1));
    if (((s->features >> 0x25 & 1) != 0) ||
       ((((uint)s->features >> 9 & 1) != 0 && (s->v7m_handler_mode != false)))) {
      (s->base).is_jmp = DISAS_TARGET_8;
    }
  }
  return (_Bool)((byte)(uVar3 >> 0xe) & 1);
}

Assistant:

static bool trans_BX(DisasContext *s, arg_BX *a)
{
    if (!ENABLE_ARCH_4T) {
        return false;
    }
    gen_bx_excret(s, load_reg(s, a->rm));
    return true;
}